

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void do_cmd_knowledge_features(char *name,wchar_t row)

{
  ushort uVar1;
  group_funcs g_funcs;
  member_funcs o_funcs;
  int *obj_list;
  char **ppcVar2;
  wchar_t o_count;
  ulong uVar3;
  long lVar4;
  
  obj_list = (int *)mem_zalloc((ulong)z_info->f_max << 2);
  uVar1 = z_info->f_max;
  ppcVar2 = &f_info->mimic;
  o_count = L'\0';
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    if ((((feature *)(ppcVar2 + -4))->name != (char *)0x0) && (*ppcVar2 == (char *)0x0)) {
      lVar4 = (long)o_count;
      o_count = o_count + L'\x01';
      obj_list[lVar4] = (int)uVar3;
    }
    ppcVar2 = ppcVar2 + 0xf;
  }
  g_funcs.gcomp = f_cmp_fkind;
  g_funcs.name = fkind_name;
  g_funcs.group = feat_order;
  g_funcs.summary = (_func_void_wchar_t_int_ptr_wchar_t_wchar_t_wchar_t_wchar_t *)0x0;
  g_funcs.maxnum = L'\t';
  g_funcs.easy_know = false;
  g_funcs._37_3_ = 0;
  o_funcs.lore = feat_lore;
  o_funcs.display_member = display_feature;
  o_funcs.xchar = f_xchar;
  o_funcs.xattr = f_xattr;
  o_funcs.xtra_prompt = feat_prompt;
  o_funcs.xtra_act = f_xtra_act;
  o_funcs._48_8_ = 0;
  display_knowledge("features",obj_list,o_count,g_funcs,o_funcs,"                    Sym");
  mem_free(obj_list);
  return;
}

Assistant:

static void do_cmd_knowledge_features(const char *name, int row)
{
	group_funcs fkind_f = {fkind_name, f_cmp_fkind, feat_order, 0,
						   N_ELEMENTS(feature_group_text), false};

	member_funcs feat_f = {display_feature, feat_lore, f_xchar, f_xattr,
						   feat_prompt, f_xtra_act, 0};

	int *features;
	int f_count = 0;
	int i;

	features = mem_zalloc(z_info->f_max * sizeof(int));

	for (i = 0; i < z_info->f_max; i++) {
		/* Ignore non-features and mimics */
		if (f_info[i].name == 0 || f_info[i].mimic)
			continue;

		/* Currently no filter for features */
		features[f_count++] = i;
	}

	display_knowledge("features", features, f_count, fkind_f, feat_f,
					  "                    Sym");
	mem_free(features);
}